

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::ListAllOptimizers_abi_cxx11_(void)

{
  char *pcVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  long lVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  pcVar1 = "expression_rewriter";
  lVar2 = 0x10;
  do {
    ::std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_RDI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar1 = *(char **)(internal_optimizer_types + lVar2);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1c0);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDI;
}

Assistant:

vector<string> ListAllOptimizers() {
	vector<string> result;
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		result.push_back(internal_optimizer_types[i].name);
	}
	return result;
}